

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O3

int dohistory(void)

{
  nh_menuitem *pnVar1;
  int iVar2;
  boolean bVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  char cVar8;
  histevent *phVar9;
  ulong uVar10;
  menulist menu;
  char buf [256];
  menulist local_148;
  char local_138 [264];
  
  bVar3 = flags.debug;
  iVar2 = program_state.gameover;
  cVar8 = (char)program_state.gameover;
  if (histcount < 2) {
    if (cVar8 == '\0') {
      pline("History has not recorded anything about you.");
    }
  }
  else {
    init_menulist(&local_148);
    if (histcount != 0) {
      lVar7 = 8;
      uVar10 = 0;
      phVar9 = histevents;
      uVar4 = histcount;
      do {
        if (((*(int *)(phVar9->what + lVar7 + -0xc) == 0) || ((iVar2 & 0xffU) != 0)) ||
           (bVar3 != '\0')) {
          pcVar5 = "# ";
          if (flags.debug == '\0') {
            pcVar5 = "";
          }
          if (cVar8 != '\0') {
            pcVar5 = "";
          }
          if (*(int *)(phVar9->what + lVar7 + -0xc) == 0) {
            pcVar5 = "";
          }
          snprintf(local_138,0x100,"%sOn T:%u you %s",pcVar5,
                   (ulong)*(uint *)(phVar9->what + lVar7 + -0x10),phVar9->what + lVar7 + -8);
          lVar6 = (long)local_148.size;
          if (local_148.size <= local_148.icount) {
            local_148.size = local_148.size * 2;
            local_148.items = (nh_menuitem *)realloc(local_148.items,lVar6 * 0x218);
          }
          pnVar1 = local_148.items + local_148.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_138);
          local_148.icount = local_148.icount + 1;
          phVar9 = histevents;
          uVar4 = histcount;
        }
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 0x108;
      } while (uVar10 < uVar4);
    }
    display_menu(local_148.items,local_148.icount,"History has recorded:",0,(int *)0x0);
    free(local_148.items);
  }
  return 0;
}

Assistant:

int dohistory(void)
{
    struct menulist menu;
    boolean over = program_state.gameover;
    boolean showall = over || wizard;
    char buf[BUFSZ];
    int i;
    
    if (histcount < 2) {
	/* you get an automatic entry on turn 1 for being born.
	 * If it's the only one, there is nothing worth reporting */
	if (!over)
	    pline("History has not recorded anything about you.");
	return 0;
    }
    
    init_menulist(&menu);
    for (i = 0; i < histcount; i++) {
	if (histevents[i].hidden && !showall)
	    continue;
	snprintf(buf, BUFSZ, "%sOn T:%u you %s",
		 (histevents[i].hidden && !over && wizard) ? "# " : "",
		 histevents[i].when, histevents[i].what);
	add_menutext(&menu, buf);
    }
    
    display_menu(menu.items, menu.icount, "History has recorded:", PICK_NONE, NULL);
    free(menu.items);
    
    return 0;
}